

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O0

void __thiscall sznet::net::TcpClient::~TcpClient(TcpClient *this)

{
  EventLoop *pEVar1;
  bool bVar2;
  LogLevel LVar3;
  LogStream *pLVar4;
  self *psVar5;
  Connector *p;
  long lVar6;
  element_type *peVar7;
  EventLoop *pEVar8;
  element_type *this_00;
  SourceFile file;
  SourceFile file_00;
  _func_void_shared_ptr<sznet::net::Connector>_ptr *local_20d8;
  type local_20d0;
  TimerCallback local_20b8;
  undefined1 local_2098 [12];
  Logger local_2088;
  code *local_10b8;
  undefined8 local_10b0;
  type local_10a8;
  Functor local_1068;
  EventLoop *local_1048;
  _Bind<void_(*(sznet::net::EventLoop_*,_std::_Placeholder<1>))(sznet::net::EventLoop_*,_const_std::shared_ptr<sznet::net::TcpConnection>_&)>
  local_1040;
  undefined1 local_1030 [8];
  CloseCallback cb;
  MutexLockGuard lock;
  undefined1 local_1000 [7];
  bool unique;
  TcpConnectionPtr conn;
  undefined4 local_fe8;
  Logger local_fe0;
  TcpClient *local_10;
  TcpClient *this_local;
  
  local_10 = this;
  LVar3 = Logger::logLevel();
  if ((int)LVar3 < 3) {
    Logger::SourceFile::SourceFile<100>
              ((SourceFile *)
               &conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpClient.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)conn.
                          super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
    file.m_size = local_fe8;
    Logger::Logger(&local_fe0,file,0x3d);
    pLVar4 = Logger::stream(&local_fe0);
    psVar5 = LogStream::operator<<(pLVar4,"TcpClient::~TcpClient[");
    psVar5 = LogStream::operator<<(psVar5,&this->m_name);
    psVar5 = LogStream::operator<<(psVar5,"] - connector ");
    p = get_pointer<sznet::net::Connector>(&this->m_connector);
    LogStream::operator<<(psVar5,p);
    Logger::~Logger(&local_fe0);
  }
  std::shared_ptr<sznet::net::TcpConnection>::shared_ptr
            ((shared_ptr<sznet::net::TcpConnection> *)local_1000);
  MutexLockGuard::MutexLockGuard((MutexLockGuard *)&cb._M_invoker,&this->m_mutex);
  lVar6 = std::__shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::use_count
                    (&(this->m_connection).
                      super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>);
  std::shared_ptr<sznet::net::TcpConnection>::operator=
            ((shared_ptr<sznet::net::TcpConnection> *)local_1000,&this->m_connection);
  MutexLockGuard::~MutexLockGuard((MutexLockGuard *)&cb._M_invoker);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1000);
  if (bVar2) {
    pEVar1 = this->m_loop;
    peVar7 = std::
             __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_1000);
    pEVar8 = TcpConnection::getLoop(peVar7);
    if (pEVar1 != pEVar8) {
      __assert_fail("m_loop == conn->getLoop()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpClient.cpp"
                    ,0x4a,"sznet::net::TcpClient::~TcpClient()");
    }
    local_1048 = (EventLoop *)detail::removeConnection;
    std::
    bind<void(*)(sznet::net::EventLoop*,std::shared_ptr<sznet::net::TcpConnection>const&),sznet::net::EventLoop*&,std::_Placeholder<1>const&>
              (&local_1040._M_f,&local_1048,(_Placeholder<1> *)this);
    std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>::
    function<std::_Bind<void(*(sznet::net::EventLoop*,std::_Placeholder<1>))(sznet::net::EventLoop*,std::shared_ptr<sznet::net::TcpConnection>const&)>,void>
              ((function<void(std::shared_ptr<sznet::net::TcpConnection>const&)> *)local_1030,
               &local_1040);
    pEVar1 = this->m_loop;
    local_10b8 = TcpConnection::setCloseCallback;
    local_10b0 = 0;
    std::
    bind<void(sznet::net::TcpConnection::*)(std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>const&),std::shared_ptr<sznet::net::TcpConnection>&,std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>&>
              (&local_10a8,(offset_in_TcpConnection_to_subr *)&local_10b8,
               (shared_ptr<sznet::net::TcpConnection> *)local_1000,
               (function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)> *)local_1030);
    std::function<void()>::
    function<std::_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>,std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>))(std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>const&)>,void>
              ((function<void()> *)&local_1068,&local_10a8);
    EventLoop::runInLoop(pEVar1,&local_1068);
    std::function<void_()>::~function(&local_1068);
    std::
    _Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>,_std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>))(const_std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>_&)>
    ::~_Bind(&local_10a8);
    if (lVar6 == 1) {
      peVar7 = std::
               __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_1000);
      TcpConnection::forceClose(peVar7);
    }
    std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::~function
              ((function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)> *)local_1030);
  }
  else {
    LVar3 = Logger::logLevel();
    if ((int)LVar3 < 3) {
      Logger::SourceFile::SourceFile<100>
                ((SourceFile *)local_2098,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpClient.cpp"
                );
      file_00._12_4_ = 0;
      file_00.m_data = (char *)local_2098._0_8_;
      file_00.m_size = local_2098._8_4_;
      Logger::Logger(&local_2088,file_00,0x58);
      pLVar4 = Logger::stream(&local_2088);
      LogStream::operator<<(pLVar4,"m_connection release!!!");
      Logger::~Logger(&local_2088);
    }
    this_00 = std::
              __shared_ptr_access<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m_connector);
    Connector::stop(this_00);
    pEVar1 = this->m_loop;
    local_20d8 = detail::removeConnector;
    std::
    bind<void(*)(std::shared_ptr<sznet::net::Connector>const&),std::shared_ptr<sznet::net::Connector>&>
              (&local_20d0,&local_20d8,&this->m_connector);
    std::function<void()>::
    function<std::_Bind<void(*(std::shared_ptr<sznet::net::Connector>))(std::shared_ptr<sznet::net::Connector>const&)>,void>
              ((function<void()> *)&local_20b8,&local_20d0);
    EventLoop::runAfter(pEVar1,1.0,&local_20b8);
    std::function<void_()>::~function(&local_20b8);
    std::
    _Bind<void_(*(std::shared_ptr<sznet::net::Connector>))(const_std::shared_ptr<sznet::net::Connector>_&)>
    ::~_Bind(&local_20d0);
  }
  std::shared_ptr<sznet::net::TcpConnection>::~shared_ptr
            ((shared_ptr<sznet::net::TcpConnection> *)local_1000);
  std::shared_ptr<sznet::net::TcpConnection>::~shared_ptr(&this->m_connection);
  MutexLock::~MutexLock(&this->m_mutex);
  std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::~function
            (&this->m_writeCompleteCallback);
  std::
  function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
  ::~function(&this->m_messageCallback);
  std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::~function
            (&this->m_connectionCallback);
  std::__cxx11::string::~string((string *)&this->m_name);
  std::shared_ptr<sznet::net::Connector>::~shared_ptr(&this->m_connector);
  return;
}

Assistant:

TcpClient::~TcpClient()
{
	LOG_INFO << "TcpClient::~TcpClient[" << m_name 
		<< "] - connector " << get_pointer(m_connector);
	TcpConnectionPtr conn;
	// TCP�����Ƿ���TcpClient(owner)���Գ���
	bool unique = false;
	{
		MutexLockGuard lock(m_mutex);
		unique = m_connection.use_count() == 1;
		// TcpClient������Ҫ�����ˣ��ڲ���Ҫ������
		conn = m_connection;
	}
	if (conn)
	{
		assert(m_loop == conn->getLoop());
		// ���������Ƿ����Գ���tcp���ӣ�����Ҫ�����ƺ����ˣ���ֹtcp�����ڴ�й¶
		// FIXME: not 100% safe, if we are in different thread
		CloseCallback cb = std::bind(&detail::removeConnection, m_loop, std::placeholders::_1);
		m_loop->runInLoop(std::bind(&TcpConnection::setCloseCallback, conn, cb));
		// ���Գ��У�ֱ��ǿ�ƹر�
		if (unique)
		{
			conn->forceClose();
		}
	}
	// tcp�����Ѿ����ͷ��ˣ���ô���ֵģ�
	else
	{
		LOG_INFO << "m_connection release!!!";
		m_connector->stop();
		// FIXME: HACK
		m_loop->runAfter(1, std::bind(&detail::removeConnector, m_connector));
	}
}